

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drop.cc
# Opt level: O0

void __thiscall verona::track::pre_block(track *this,Node *block)

{
  bool bVar1;
  reference pvVar2;
  vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
  *pvVar3;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar4;
  NodeDef *pNVar5;
  NodeDef *pNVar6;
  mapped_type *this_01;
  mapped_type *pmVar7;
  mapped_type *this_02;
  shared_ptr<trieste::NodeDef> *child;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  value_type parent;
  Node *block_local;
  track *this_local;
  
  if ((this->llvm & 1U) == 0) {
    parent.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)block;
    bVar1 = ::std::
            vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ::empty((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     *)&this->stack);
    if (bVar1) {
      pmVar7 = ::std::
               map<std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>_>_>_>
               ::operator[](&this->lets,block);
      ::std::
      map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
      ::operator=(pmVar7,&this->params);
    }
    else {
      pvVar2 = ::std::
               vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ::back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       *)&this->stack);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                ((shared_ptr<trieste::NodeDef> *)&__range3,pvVar2);
      pvVar3 = (vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                *)::std::
                  map<std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                  ::operator[](&this->children,(shared_ptr<trieste::NodeDef> *)&__range3);
      __end3 = ::std::
               vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ::begin(pvVar3);
      child = (shared_ptr<trieste::NodeDef> *)
              ::std::
              vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              ::end(pvVar3);
      while (bVar1 = __gnu_cxx::
                     operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                               (&__end3,(__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                         *)&child), ((bVar1 ^ 0xffU) & 1) != 0) {
        this_00 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )__gnu_cxx::
                   __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                   ::operator*(&__end3);
        peVar4 = ::std::
                 __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_00);
        pNVar5 = trieste::NodeDef::parent(peVar4);
        peVar4 = ::std::
                 __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)block);
        pNVar6 = trieste::NodeDef::parent(peVar4);
        if (pNVar5 != pNVar6) {
          pvVar3 = (vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    *)::std::
                      map<std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                      ::operator[](&this->successors,(key_type *)this_00);
          ::std::
          vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ::push_back(pvVar3,block);
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
        ::operator++(&__end3);
      }
      pvVar3 = (vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                *)::std::
                  map<std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                  ::operator[](&this->children,(key_type *)&__range3);
      ::std::
      vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
      ::push_back(pvVar3,block);
      this_01 = ::std::
                map<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
                ::operator[](&this->parents,block);
      ::std::shared_ptr<trieste::NodeDef>::operator=
                (this_01,(shared_ptr<trieste::NodeDef> *)&__range3);
      pmVar7 = ::std::
               map<std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>_>_>_>
               ::operator[](&this->lets,(shared_ptr<trieste::NodeDef> *)&__range3);
      this_02 = ::std::
                map<std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>_>_>_>
                ::operator[](&this->lets,block);
      ::std::
      map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
      ::operator=(this_02,pmVar7);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&__range3);
    }
    ::std::
    vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>::
    push_back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               *)&this->stack,block);
    ::std::
    vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>::
    push_back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               *)this,block);
  }
  return;
}

Assistant:

void pre_block(Node block)
    {
      if (llvm)
        return;

      if (stack.empty())
      {
        lets[block] = params;
      }
      else
      {
        auto parent = stack.back();

        for (auto& child : children[parent])
        {
          // The new child is a successor of the old children unless it's a
          // sibling block in a conditional.
          if (child->parent() != block->parent())
            successors[child].push_back(block);
        }

        children[parent].push_back(block);
        parents[block] = parent;
        lets[block] = lets[parent];
      }

      stack.push_back(block);
      blocks.push_back(block);
    }